

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_bitfield_ins(m68k_info *info,int opcode,int has_d_arg)

{
  byte bVar1;
  uint uVar2;
  cs_m68k *op;
  byte bVar3;
  
  op = build_init_op(info,opcode,1,0);
  uVar2 = read_imm_16(info);
  if ((uVar2 & 0x20) == 0) {
    bVar3 = (byte)g_5bit_data_table[uVar2 & 0x1f];
  }
  else {
    bVar3 = (byte)uVar2 & 7;
  }
  if (has_d_arg != 0) {
    op->op_count = '\x02';
    op->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
    op->operands[1].field_0.reg = (uVar2 >> 0xc & 7) + M68K_REG_D0;
  }
  bVar1 = 7;
  if ((uVar2 >> 0xb & 1) == 0) {
    bVar1 = 0x1f;
  }
  get_ea_mode_op(info,op->operands,info->ir,1);
  op->operands[0].mem.bitfield = '\x01';
  op->operands[0].mem.width = bVar3;
  op->operands[0].mem.offset = bVar1 & (byte)(uVar2 >> 6);
  return;
}

Assistant:

static void build_bitfield_ins(m68k_info *info, int opcode, int has_d_arg)
{
	uint8_t offset;
	uint8_t width;
	cs_m68k_op* op_ea;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 1, 0);
	uint extension = read_imm_16(info);

	op_ea = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension))
		offset = (extension >> 6) & 7;
	else
		offset = (extension >> 6) & 31;

	if (BIT_5(extension))
		width = extension & 7;
	else
		width = (uint8_t)g_5bit_data_table[extension & 31];

	if (has_d_arg) {
		ext->op_count = 2;
		op1->address_mode = M68K_AM_REG_DIRECT_DATA;
		op1->reg = M68K_REG_D0 + ((extension >> 12) & 7);
	}

	get_ea_mode_op(info, op_ea, info->ir, 1);

	op_ea->mem.bitfield = 1;
	op_ea->mem.width = width;
	op_ea->mem.offset = offset;
}